

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

ArgSlot EmitArgListEnd(ParseNode *pnode,RegSlot thisLocation,RegSlot evalLocation,
                      RegSlot newTargetLocation,ByteCodeGenerator *byteCodeGenerator,
                      FuncInfo *funcInfo,size_t argIndex,ProfileId callSiteId)

{
  code *pcVar1;
  bool bVar2;
  short sVar3;
  uint32 uVar4;
  RegSlot reg;
  RegSlot RVar5;
  undefined4 *puVar6;
  ByteCodeWriter *pBVar7;
  bool bVar8;
  bool bVar9;
  RegSlot local_4c;
  ArgSlot argIntCount;
  RegSlot evalEnv;
  ArgSlot evalIndex;
  ArgSlot argSlotIndex;
  BOOL fHasNewTarget;
  BOOL fIsEval;
  BOOL fEvalInModule;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot newTargetLocation_local;
  RegSlot evalLocation_local;
  RegSlot thisLocation_local;
  ParseNode *pnode_local;
  
  bVar8 = evalLocation != 0xffffffff;
  bVar9 = newTargetLocation != 0xffffffff;
  if (0xfffa < argIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1d9c,"(argIndex < Js::Constants::UShortMaxValue - maxExtraArgSlot)",
                       "Number of allowed arguments are already capped at parser level");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  sVar3 = (short)argIndex;
  if ((bVar8) && (sVar3 != 0)) {
    if (bVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1da3,"(!fHasNewTarget)","!fHasNewTarget");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = FuncInfo::IsGlobalFunction(funcInfo);
    if ((!bVar2) ||
       ((bVar2 = FuncInfo::GetIsStrictMode(funcInfo), bVar2 &&
        (uVar4 = ByteCodeGenerator::GetFlags(byteCodeGenerator), (uVar4 & 0x400) != 0)))) {
      local_4c = funcInfo->frameDisplayRegister;
    }
    else {
      local_4c = FuncInfo::GetEnvRegister(funcInfo);
    }
    reg = ByteCodeGenerator::PrependLocalScopes(byteCodeGenerator,local_4c,evalLocation,funcInfo);
    RVar5 = FuncInfo::GetEnvRegister(funcInfo);
    if ((reg == RVar5) || (reg == funcInfo->frameDisplayRegister)) {
      pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::ArgOutEnv(pBVar7,sVar3 + 1U);
    }
    else {
      pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::ArgOut<false>(pBVar7,sVar3 + 1U,reg,callSiteId,false);
    }
  }
  if (bVar9) {
    if (bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1dc9,"(!fIsEval)","!fIsEval");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::ArgOut<true>(pBVar7,sVar3 + 1,newTargetLocation,callSiteId,false);
  }
  pnode_local._6_2_ = sVar3 + 1 + (ushort)bVar8 + (ushort)bVar9;
  if ((bVar8) && (pnode == (ParseNode *)0x0)) {
    pnode_local._6_2_ = 1;
  }
  return pnode_local._6_2_;
}

Assistant:

Js::ArgSlot EmitArgListEnd(
    ParseNode *pnode,
    Js::RegSlot thisLocation,
    Js::RegSlot evalLocation,
    Js::RegSlot newTargetLocation,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    size_t argIndex,
    Js::ProfileId callSiteId)
{
    BOOL fEvalInModule = false;
    BOOL fIsEval = (evalLocation != Js::Constants::NoRegister);
    BOOL fHasNewTarget = (newTargetLocation != Js::Constants::NoRegister);

    static const size_t maxExtraArgSlot = 4;  // max(extraEvalArg, extraArg), where extraEvalArg==2 (moduleRoot,env), extraArg==4 (this, eval, evalInModule, newTarget)
    AssertOrFailFastMsg(argIndex < Js::Constants::UShortMaxValue - maxExtraArgSlot, "Number of allowed arguments are already capped at parser level");

    Js::ArgSlot argSlotIndex = (Js::ArgSlot) argIndex;
    Js::ArgSlot evalIndex;

    if (fIsEval && argSlotIndex > 0)
    {
        Assert(!fHasNewTarget);

        // Pass the frame display as an extra argument to "eval".
        // Do this only if eval is called with some args
        Js::RegSlot evalEnv;
        if (funcInfo->IsGlobalFunction() && !(funcInfo->GetIsStrictMode() && byteCodeGenerator->GetFlags() & fscrEval))
        {
            // Use current environment as the environment for the function being called when:
            // - this is the root global function (not an eval's global function)
            // - this is an eval's global function that is not in strict mode (see else block)
            evalEnv = funcInfo->GetEnvRegister();
        }
        else
        {
            // Use the frame display as the environment for the function being called when:
            // - this is not a global function and thus it will have its own scope
            // - this is an eval's global function that is in strict mode, since in strict mode the eval's global function
            //   has its own scope
            evalEnv = funcInfo->frameDisplayRegister;
        }

        evalEnv = byteCodeGenerator->PrependLocalScopes(evalEnv, evalLocation, funcInfo);

        // Passing the FrameDisplay as an extra argument
        evalIndex = argSlotIndex + 1;

        if (evalEnv == funcInfo->GetEnvRegister() || evalEnv == funcInfo->frameDisplayRegister)
        {
            byteCodeGenerator->Writer()->ArgOutEnv(evalIndex);
        }
        else
        {
            byteCodeGenerator->Writer()->ArgOut<false>(evalIndex, evalEnv, callSiteId, false /*emitProfiledArgout*/);
        }
    }

    if (fHasNewTarget)
    {
        Assert(!fIsEval);

        byteCodeGenerator->Writer()->ArgOut<true>(argSlotIndex + 1, newTargetLocation, callSiteId, false /*emitProfiledArgout*/);
    }

    Js::ArgSlot argIntCount = argSlotIndex + 1 + (Js::ArgSlot)fIsEval + (Js::ArgSlot)fEvalInModule + (Js::ArgSlot)fHasNewTarget;

    // eval and no args passed, return 1 as argument count
    if (fIsEval && pnode == nullptr)
    {
        return 1;
    }

    return argIntCount;
}